

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

void pospopcnt_u8_avx2_horizreduce(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 (*pauVar1) [32];
  ulong uVar2;
  int j;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  
  if ((len & 0xffffffffffffff80) == 0) {
    auVar16 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar11 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar10 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar9 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar8 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar5 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar7 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    auVar6 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
  }
  else {
    pauVar1 = (undefined1 (*) [32])(data + (len & 0xffffffffffffff80));
    auVar26._8_4_ = 0x55555555;
    auVar26._0_8_ = 0x5555555555555555;
    auVar26._12_4_ = 0x55555555;
    auVar26._16_4_ = 0x55555555;
    auVar26._20_4_ = 0x55555555;
    auVar26._24_4_ = 0x55555555;
    auVar26._28_4_ = 0x55555555;
    auVar27._8_4_ = 0x33333333;
    auVar27._0_8_ = 0x3333333333333333;
    auVar27._12_4_ = 0x33333333;
    auVar27._16_4_ = 0x33333333;
    auVar27._20_4_ = 0x33333333;
    auVar27._24_4_ = 0x33333333;
    auVar27._28_4_ = 0x33333333;
    auVar13[8] = 7;
    auVar13._0_8_ = 0x707070707070707;
    auVar13[9] = 7;
    auVar13[10] = 7;
    auVar13[0xb] = 7;
    auVar13[0xc] = 7;
    auVar13[0xd] = 7;
    auVar13[0xe] = 7;
    auVar13[0xf] = 7;
    auVar13[0x10] = 7;
    auVar13[0x11] = 7;
    auVar13[0x12] = 7;
    auVar13[0x13] = 7;
    auVar13[0x14] = 7;
    auVar13[0x15] = 7;
    auVar13[0x16] = 7;
    auVar13[0x17] = 7;
    auVar13[0x18] = 7;
    auVar13[0x19] = 7;
    auVar13[0x1a] = 7;
    auVar13[0x1b] = 7;
    auVar13[0x1c] = 7;
    auVar13[0x1d] = 7;
    auVar13[0x1e] = 7;
    auVar13[0x1f] = 7;
    auVar29[8] = 0x70;
    auVar29._0_8_ = 0x7070707070707070;
    auVar29[9] = 0x70;
    auVar29[10] = 0x70;
    auVar29[0xb] = 0x70;
    auVar29[0xc] = 0x70;
    auVar29[0xd] = 0x70;
    auVar29[0xe] = 0x70;
    auVar29[0xf] = 0x70;
    auVar29[0x10] = 0x70;
    auVar29[0x11] = 0x70;
    auVar29[0x12] = 0x70;
    auVar29[0x13] = 0x70;
    auVar29[0x14] = 0x70;
    auVar29[0x15] = 0x70;
    auVar29[0x16] = 0x70;
    auVar29[0x17] = 0x70;
    auVar29[0x18] = 0x70;
    auVar29[0x19] = 0x70;
    auVar29[0x1a] = 0x70;
    auVar29[0x1b] = 0x70;
    auVar29[0x1c] = 0x70;
    auVar29[0x1d] = 0x70;
    auVar29[0x1e] = 0x70;
    auVar29[0x1f] = 0x70;
    auVar23 = ZEXT1664((undefined1  [16])0x0);
    auVar19 = ZEXT1664((undefined1  [16])0x0);
    auVar24 = ZEXT1664((undefined1  [16])0x0);
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    auVar22 = ZEXT1664((undefined1  [16])0x0);
    auVar18 = ZEXT1664((undefined1  [16])0x0);
    auVar21 = ZEXT1664((undefined1  [16])0x0);
    auVar17 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar5 = vmovdqu64_avx512vl(*(undefined1 (*) [32])((long)data + 0x60));
      auVar6 = vpandd_avx512vl(*(undefined1 (*) [32])data,auVar26);
      auVar7 = vpandd_avx512vl(*(undefined1 (*) [32])((long)data + 0x20),auVar26);
      auVar8 = vpaddd_avx512vl(auVar7,auVar6);
      auVar6 = vpsrld_avx2(*(undefined1 (*) [32])data,1);
      auVar7 = vpsrld_avx2(*(undefined1 (*) [32])((long)data + 0x20),1);
      auVar6 = vpand_avx2(auVar6,auVar26);
      auVar7 = vpand_avx2(auVar7,auVar26);
      auVar6 = vpaddd_avx2(auVar7,auVar6);
      auVar7 = vpand_avx2(*(undefined1 (*) [32])((long)data + 0x40),auVar26);
      auVar9 = vpandd_avx512vl(auVar5,auVar26);
      auVar9 = vpaddd_avx512vl(auVar9,auVar7);
      auVar7 = vpsrld_avx2(*(undefined1 (*) [32])((long)data + 0x40),1);
      auVar5 = vpsrld_avx512vl(auVar5,1);
      auVar7 = vpand_avx2(auVar7,auVar26);
      auVar5 = vpandd_avx512vl(auVar5,auVar26);
      auVar5 = vpaddd_avx512vl(auVar5,auVar7);
      auVar7 = vpandd_avx512vl(auVar8,auVar27);
      auVar10 = vpandd_avx512vl(auVar9,auVar27);
      auVar10 = vpaddd_avx512vl(auVar10,auVar7);
      auVar7 = vpandd_avx512vl(auVar6,auVar27);
      auVar11 = vpandd_avx512vl(auVar5,auVar27);
      auVar11 = vpaddd_avx512vl(auVar11,auVar7);
      auVar7 = vpsrld_avx512vl(auVar8,2);
      auVar9 = vpsrld_avx2(auVar9,2);
      auVar8 = vpandd_avx512vl(auVar7,auVar27);
      auVar7 = vpand_avx2(auVar9,auVar27);
      auVar12 = vpaddd_avx512vl(auVar7,auVar8);
      auVar6 = vpsrld_avx2(auVar6,2);
      auVar7 = vpsrld_avx2(auVar5,2);
      auVar6 = vpand_avx2(auVar6,auVar27);
      auVar7 = vpand_avx2(auVar7,auVar27);
      auVar16 = vpaddd_avx2(auVar7,auVar6);
      auVar6 = vpandq_avx512vl(auVar10,auVar13);
      auVar25 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar6 = vpsadbw_avx2(auVar6,auVar25);
      auVar6 = vpaddq_avx2(auVar6,auVar23._0_32_);
      auVar23 = ZEXT3264(auVar6);
      auVar7 = vpandq_avx512vl(auVar10,auVar29);
      auVar7 = vpsadbw_avx2(auVar7,auVar25);
      auVar7 = vpaddq_avx2(auVar7,auVar19._0_32_);
      auVar19 = ZEXT3264(auVar7);
      auVar5 = vpandq_avx512vl(auVar11,auVar13);
      auVar5 = vpsadbw_avx2(auVar5,auVar25);
      auVar5 = vpaddq_avx2(auVar5,auVar24._0_32_);
      auVar24 = ZEXT3264(auVar5);
      auVar8 = vpandq_avx512vl(auVar11,auVar29);
      auVar8 = vpsadbw_avx2(auVar8,auVar25);
      auVar8 = vpaddq_avx2(auVar8,auVar20._0_32_);
      auVar20 = ZEXT3264(auVar8);
      auVar9 = vpand_avx2(auVar12,auVar13);
      auVar9 = vpsadbw_avx2(auVar9,auVar25);
      auVar9 = vpaddq_avx2(auVar9,auVar22._0_32_);
      auVar22 = ZEXT3264(auVar9);
      auVar10 = vpand_avx2(auVar12,auVar29);
      auVar10 = vpsadbw_avx2(auVar10,auVar25);
      auVar10 = vpaddq_avx2(auVar10,auVar18._0_32_);
      auVar18 = ZEXT3264(auVar10);
      auVar11 = vpand_avx2(auVar16,auVar13);
      auVar11 = vpsadbw_avx2(auVar11,auVar25);
      auVar11 = vpaddq_avx2(auVar11,auVar21._0_32_);
      auVar21 = ZEXT3264(auVar11);
      auVar16 = vpand_avx2(auVar16,auVar29);
      auVar16 = vpsadbw_avx2(auVar16,auVar25);
      auVar16 = vpaddq_avx2(auVar16,auVar17._0_32_);
      auVar17 = ZEXT3264(auVar16);
      data = (uint8_t *)((long)data + 0x80);
    } while ((undefined1 (*) [32])data != pauVar1);
  }
  auVar4 = vpunpcklqdq_avx(auVar6._0_16_,auVar5._0_16_);
  auVar12._0_16_ = ZEXT116(0) * auVar9._0_16_ + ZEXT116(1) * auVar4;
  auVar12._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar9._0_16_;
  uVar14 = auVar11._0_8_;
  auVar25._8_8_ = uVar14;
  auVar25._0_8_ = uVar14;
  auVar25._16_8_ = uVar14;
  auVar25._24_8_ = uVar14;
  auVar26 = vpblendd_avx2(auVar12,auVar25,0xc0);
  auVar4 = vpunpckhqdq_avx(auVar6._0_16_,auVar5._0_16_);
  auVar27 = vpermq_avx2(auVar9,0x55);
  auVar27 = vpblendd_avx2(ZEXT1632(auVar4),auVar27,0xf0);
  auVar15 = auVar16._0_16_;
  auVar28._0_16_ = ZEXT116(0) * auVar11._0_16_ + ZEXT116(1) * auVar15;
  auVar28._16_16_ = ZEXT116(0) * auVar16._16_16_ + ZEXT116(1) * auVar11._0_16_;
  auVar27 = vpblendd_avx2(auVar27,auVar28,0xc0);
  auVar26 = vpaddq_avx2(auVar26,auVar27);
  auVar27 = vpunpcklqdq_avx2(auVar6,auVar5);
  auVar13 = vperm2i128_avx2(auVar27,auVar9,0x31);
  auVar27 = vpmovsxbq_avx2(ZEXT416(0x6020100));
  auVar13 = vpermt2q_avx512vl(auVar13,auVar27,auVar11);
  auVar26 = vpaddq_avx2(auVar26,auVar13);
  auVar6 = vpunpckhqdq_avx2(auVar6,auVar5);
  auVar5 = vpmovsxbq_avx2(ZEXT416(0x7070302));
  auVar6 = vpermt2q_avx512vl(auVar6,auVar5,auVar9);
  auVar6 = vpblendd_avx2(auVar6,auVar11,0xc0);
  auVar6 = vpaddq_avx2(auVar26,auVar6);
  auVar4 = vpmovqd_avx512vl(auVar6);
  auVar4 = vpaddd_avx(auVar4,*(undefined1 (*) [16])flag_counts);
  *(undefined1 (*) [16])flag_counts = auVar4;
  auVar4 = vpunpcklqdq_avx(auVar7._0_16_,auVar8._0_16_);
  auVar6._0_16_ = ZEXT116(0) * auVar10._0_16_ + ZEXT116(1) * auVar4;
  auVar6._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar10._0_16_;
  uVar14 = auVar16._0_8_;
  auVar9._8_8_ = uVar14;
  auVar9._0_8_ = uVar14;
  auVar9._16_8_ = uVar14;
  auVar9._24_8_ = uVar14;
  auVar6 = vpblendd_avx2(auVar6,auVar9,0xc0);
  auVar4 = vpunpckhqdq_avx(auVar7._0_16_,auVar8._0_16_);
  auVar9 = vpermq_avx2(auVar10,0x55);
  auVar9 = vpblendd_avx2(ZEXT1632(auVar4),auVar9,0xf0);
  auVar11._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar15;
  auVar11._16_16_ = ZEXT116(0) * auVar16._16_16_ + ZEXT116(1) * auVar15;
  auVar9 = vpblendd_avx2(auVar9,auVar11,0xc0);
  auVar6 = vpaddq_avx2(auVar6,auVar9);
  auVar9 = vpunpcklqdq_avx2(auVar7,auVar8);
  auVar9 = vperm2i128_avx2(auVar9,auVar10,0x31);
  auVar9 = vpermt2q_avx512vl(auVar9,auVar27,auVar16);
  auVar6 = vpaddq_avx2(auVar6,auVar9);
  auVar7 = vpunpckhqdq_avx2(auVar7,auVar8);
  auVar7 = vpermt2q_avx512vl(auVar7,auVar5,auVar10);
  auVar7 = vpblendd_avx2(auVar7,auVar16,0xc0);
  auVar6 = vpaddq_avx2(auVar6,auVar7);
  auVar6 = vpsrlq_avx2(auVar6,4);
  auVar4 = vpmovqd_avx512vl(auVar6);
  auVar4 = vpaddd_avx(auVar4,*(undefined1 (*) [16])(flag_counts + 4));
  *(undefined1 (*) [16])(flag_counts + 4) = auVar4;
  if ((len & 0xff) != 0) {
    uVar2 = 0;
    do {
      lVar3 = 0;
      do {
        flag_counts[lVar3] =
             flag_counts[lVar3] +
             (uint)(((byte)(*(undefined1 (*) [32])data)[uVar2] >> ((uint)lVar3 & 0x1f) & 1) != 0);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 8);
      uVar2 = uVar2 + 1;
    } while (uVar2 != (len & 0xff));
  }
  return;
}

Assistant:

void pospopcnt_u8_avx2_horizreduce(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m256i zero = _mm256_setzero_si256();

    __m256i counter_a = zero;
    __m256i counter_b = zero;
    __m256i counter_c = zero;
    __m256i counter_d = zero;
    __m256i counter_e = zero;
    __m256i counter_f = zero;
    __m256i counter_g = zero;
    __m256i counter_h = zero;

    for (const uint8_t* end = &data[(len & ~127)]; data != end; data += 128) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m256i r0 = _mm256_loadu_si256((__m256i*)&data[0*32]);
        const __m256i r1 = _mm256_loadu_si256((__m256i*)&data[1*32]);
        const __m256i r2 = _mm256_loadu_si256((__m256i*)&data[2*32]);
        const __m256i r3 = _mm256_loadu_si256((__m256i*)&data[3*32]);

        // s0 = [a0+a1|c0+c1|e0+e1|g0+g1]
        // s1 = [b0+b1|d0+d1|f0+f1|h0+h1]
        // s2 = [a2+a3|c2+c3|e2+e3|g2+g3]
        // s3 = [b2+b3|d2+d3|f2+f3|h2+h3]
        const __m256i s0 = avx2_add1_even(r0, r1);
        const __m256i s1 = avx2_add1_odd (r0, r1);
        const __m256i s2 = avx2_add1_even(r2, r3);
        const __m256i s3 = avx2_add1_odd (r2, r3);

        // d0 = [a0+a1+a2+a3|e0+e1+e2+e3]
        // d1 = [b0+b1+b2+b3|f0+f1+f2+f3]
        // d2 = [c0+c1+c2+c3|g0+g1+g2+g3]
        // d3 = [d0+d1+d2+d3|h0+h1+h2+h3]
        const __m256i d0 = avx2_add2_even(s0, s2);
        const __m256i d1 = avx2_add2_even(s1, s3);
        const __m256i d2 = avx2_add2_odd (s0, s2);
        const __m256i d3 = avx2_add2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m256i mask_lo = _mm256_set1_epi8(0x0f);
        const __m256i mask_hi = _mm256_set1_epi8(0xf0);
        // Note: counter for higher nibble have to be divided by 16
        const __m256i sum0 = _mm256_sad_epu8(d0 & mask_lo, zero);
        const __m256i sum1 = _mm256_sad_epu8(d0 & mask_hi, zero);
        const __m256i sum2 = _mm256_sad_epu8(d1 & mask_lo, zero);
        const __m256i sum3 = _mm256_sad_epu8(d1 & mask_hi, zero);
        const __m256i sum4 = _mm256_sad_epu8(d2 & mask_lo, zero);
        const __m256i sum5 = _mm256_sad_epu8(d2 & mask_hi, zero);
        const __m256i sum6 = _mm256_sad_epu8(d3 & mask_lo, zero);
        const __m256i sum7 = _mm256_sad_epu8(d3 & mask_hi, zero);

        counter_a = _mm256_add_epi64(counter_a, sum0);
        counter_b = _mm256_add_epi64(counter_b, sum1);
        counter_c = _mm256_add_epi64(counter_c, sum2);
        counter_d = _mm256_add_epi64(counter_d, sum3);
        counter_e = _mm256_add_epi64(counter_e, sum4);
        counter_f = _mm256_add_epi64(counter_f, sum5);
        counter_g = _mm256_add_epi64(counter_g, sum6);
        counter_h = _mm256_add_epi64(counter_h, sum7);
    }

    flag_counts[0] += avx2_sum_epu64(counter_a);
    flag_counts[1] += avx2_sum_epu64(counter_c);
    flag_counts[2] += avx2_sum_epu64(counter_e);
    flag_counts[3] += avx2_sum_epu64(counter_g);
    flag_counts[4] += avx2_sum_epu64(counter_b) >> 4;
    flag_counts[5] += avx2_sum_epu64(counter_d) >> 4;
    flag_counts[6] += avx2_sum_epu64(counter_f) >> 4;
    flag_counts[7] += avx2_sum_epu64(counter_h) >> 4;

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % 256, flag_counts);
}